

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

time_t __thiscall QDateTime::time(QDateTime *this,time_t *__timer)

{
  bool bVar1;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffd8;
  StatusFlag in_stack_ffffffffffffffdc;
  QTime local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  getStatus(&this->d);
  bVar1 = QFlags<QDateTimePrivate::StatusFlag>::testFlag
                    ((QFlags<QDateTimePrivate::StatusFlag> *)this,in_stack_ffffffffffffffdc);
  if (bVar1) {
    getMSecs((QDateTimeData *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    local_c = msecsToTime(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  else {
    QTime::QTime(&local_c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (ulong)(uint)local_c.mds;
  }
  __stack_chk_fail();
}

Assistant:

QTime QDateTime::time() const
{
    return getStatus(d).testFlag(QDateTimePrivate::ValidTime) ? msecsToTime(getMSecs(d)) : QTime();
}